

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_new.c
# Opt level: O2

LY_ERR lyd_create_term2(lysc_node *schema,lyd_value *val,lyd_node **node)

{
  uint __line;
  LY_ERR err;
  lyd_node *node_00;
  char *__assertion;
  
  if ((schema->nodetype & 0xc) == 0) {
    __assertion = "schema->nodetype & LYD_NODE_TERM";
    __line = 0x58;
  }
  else {
    if ((val != (lyd_value *)0x0) && (val->realtype != (lysc_type *)0x0)) {
      node_00 = (lyd_node *)calloc(1,0x60);
      if (node_00 == (lyd_node *)0x0) {
        err = LY_EMEM;
        ly_log(schema->module->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
               "lyd_create_term2");
      }
      else {
        node_00->schema = schema;
        node_00->prev = node_00;
        node_00->flags = 4;
        err = (*(code *)(schema[1].parent)->parent->dsc)(schema->module->ctx,val,node_00 + 1);
        if (err == LY_SUCCESS) {
          lyd_hash(node_00);
          *node = node_00;
          err = LY_SUCCESS;
        }
        else {
          ly_log(schema->module->ctx,LY_LLERR,err,"Value duplication failed.");
          free(node_00);
        }
      }
      return err;
    }
    __assertion = "val && val->realtype";
    __line = 0x59;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_new.c"
                ,__line,
                "LY_ERR lyd_create_term2(const struct lysc_node *, const struct lyd_value *, struct lyd_node **)"
               );
}

Assistant:

LY_ERR
lyd_create_term2(const struct lysc_node *schema, const struct lyd_value *val, struct lyd_node **node)
{
    LY_ERR ret;
    struct lyd_node_term *term;
    struct lysc_type *type;

    assert(schema->nodetype & LYD_NODE_TERM);
    assert(val && val->realtype);

    term = calloc(1, sizeof *term);
    LY_CHECK_ERR_RET(!term, LOGMEM(schema->module->ctx), LY_EMEM);

    term->schema = schema;
    term->prev = &term->node;
    term->flags = LYD_NEW;

    type = ((struct lysc_node_leaf *)schema)->type;
    ret = type->plugin->duplicate(schema->module->ctx, val, &term->value);
    if (ret) {
        LOGERR(schema->module->ctx, ret, "Value duplication failed.");
        free(term);
        return ret;
    }
    lyd_hash(&term->node);

    *node = &term->node;
    return ret;
}